

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrProc.h
# Opt level: O0

void ReadLevelFile(string *path,string *words)

{
  bool bVar1;
  LevelFileReader local_258;
  string str;
  int local_238;
  int i;
  LevelFileReader local_228;
  LevelFileReader fileReader;
  ifstream file;
  string *words_local;
  string *path_local;
  
  std::ifstream::ifstream((ifstream *)&fileReader,path,8);
  LevelFileReader::LevelFileReader(&local_228,(ifstream *)&fileReader);
  local_238 = 0;
  while( true ) {
    LevelFileReader::GetWord_abi_cxx11_(&local_258);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_258,anon_var_dwarf_a91 + 0x12);
    if (!bVar1) {
      std::__cxx11::string::operator=
                ((string *)(words + (long)local_238 * 0x20),(string *)&local_258);
    }
    std::__cxx11::string::~string((string *)&local_258);
    if (bVar1) break;
    local_238 = local_238 + 1;
  }
  LevelFileReader::~LevelFileReader(&local_228);
  std::ifstream::~ifstream(&fileReader);
  return;
}

Assistant:

void ReadLevelFile(const string& path, string* words)
{
    ifstream file(path);
    LevelFileReader fileReader(file);

    for (int i = 0; true; i++)
    {
      string str = fileReader.GetWord();
      if (str == "") break;
      words[i] = str;
    }

    return;
}